

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  rep rVar2;
  double dVar3;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_88;
  duration<long,_std::ratio<1L,_1000000000L>_> local_80;
  duration<long,_std::ratio<1L,_1000L>_> local_78;
  function<double_(double)> local_70;
  double local_50;
  double res;
  time_point t;
  runtime_error *err;
  int local_24;
  double dStack_20;
  int th;
  double h;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  h = (double)argv;
  argv_local._0_4_ = argc;
  parse_arg(argc,argv,&stack0xffffffffffffffe0,&local_24);
  res = (double)std::chrono::_V2::system_clock::now();
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0xf);
  std::function<double(double)>::function<double(&)(double),void>
            ((function<double(double)> *)&local_70,y);
  dVar3 = integrate(&local_70,-2.99,0.0,dStack_20,local_24);
  std::function<double_(double)>::~function(&local_70);
  local_50 = dVar3;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar3);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50 - 1.59530474926);
  std::operator<<(poVar1,")\n\t");
  local_88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_80.__r = (rep)std::chrono::operator-
                                (&local_88,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&res);
  local_78.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_80);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_78);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar2);
  std::operator<<(poVar1," ms");
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]){
  double h;
  int th;
  try{
    parse_arg(argc, argv, h, th);
  }catch(std::runtime_error &err){
    std::cerr << err.what();
    return -1;
  }
  auto t = std::chrono::high_resolution_clock::now();
  std::cout.precision(15);
  auto res = integrate(y, -2.99, 0, h, th);
  std::cout << res << "(" << (res - 1.59530474926)  <<")\n\t";
  std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - t).count() <<" ms";
}